

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O3

void soplex::
     SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
               (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *keys,int end,ElementCompare *compare,int start,bool type)

{
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar1;
  uint *puVar2;
  bool bVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int32_t iVar20;
  fpclass_type fVar21;
  int32_t iVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  int start_00;
  uint uVar28;
  int iVar29;
  long lVar30;
  uint uVar31;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  int iVar36;
  Element *pEVar37;
  Element local_88;
  ulong uVar32;
  
  uVar26 = (ulong)(uint)start;
  if (start + 1 < end) {
    uVar31 = end - 1;
    uVar32 = (ulong)uVar31;
    uVar28 = uVar31 - start;
    if (0x18 < (int)uVar28) {
LAB_0043cfff:
      start_00 = (int)uVar26;
      iVar29 = (uVar28 >> 1) + start_00;
      pNVar1 = keys + iVar29;
      local_88.val.m_backend.data._M_elems._0_8_ =
           *(undefined8 *)keys[iVar29].val.m_backend.data._M_elems;
      local_88.val.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(keys[iVar29].val.m_backend.data._M_elems + 2);
      puVar2 = keys[iVar29].val.m_backend.data._M_elems + 4;
      local_88.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_88.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[iVar29].val.m_backend.data._M_elems + 8;
      local_88.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
      local_88.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[iVar29].val.m_backend.data._M_elems + 0xc;
      local_88.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
      local_88.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
      local_88.val.m_backend.exp = keys[iVar29].val.m_backend.exp;
      local_88.val.m_backend.neg = keys[iVar29].val.m_backend.neg;
      local_88.val.m_backend.fpclass = keys[iVar29].val.m_backend.fpclass;
      local_88.val.m_backend.prec_elem = keys[iVar29].val.m_backend.prec_elem;
      local_88.idx = keys[iVar29].idx;
      iVar29 = (int)uVar32;
      lVar27 = (long)iVar29;
      lVar25 = (long)start_00;
      uVar34 = uVar32;
      uVar33 = uVar26;
      do {
        iVar36 = (int)uVar33;
        iVar24 = (int)uVar34;
        if ((type & 1U) == 0) {
          if (iVar36 < iVar29) {
            pEVar37 = keys + iVar36;
            lVar30 = 0;
            do {
              iVar23 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::ElementCompare::operator()(compare,pEVar37,&local_88);
              if (0 < iVar23) {
                uVar33 = (ulong)(uint)(iVar36 - (int)lVar30);
                break;
              }
              lVar30 = lVar30 + -1;
              pEVar37 = pEVar37 + 1;
              uVar33 = uVar32;
            } while ((long)iVar36 + -lVar27 != lVar30);
          }
          if (start_00 < iVar24) {
            uVar28 = (uint)uVar33;
            uVar33 = (ulong)iVar24;
            pEVar37 = keys + uVar33;
            do {
              iVar24 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::ElementCompare::operator()(compare,pEVar37,&local_88);
              uVar34 = uVar33;
              if (iVar24 < 1) break;
              uVar33 = uVar33 - 1;
              pEVar37 = pEVar37 + -1;
              uVar34 = uVar26;
            } while (lVar25 < (long)uVar33);
            goto LAB_0043d1f2;
          }
        }
        else {
          if (iVar36 < iVar29) {
            pEVar37 = keys + iVar36;
            lVar30 = 0;
            do {
              iVar23 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::ElementCompare::operator()(compare,pEVar37,&local_88);
              if (-1 < iVar23) {
                uVar33 = (ulong)(uint)(iVar36 - (int)lVar30);
                break;
              }
              lVar30 = lVar30 + -1;
              pEVar37 = pEVar37 + 1;
              uVar33 = uVar32;
            } while ((long)iVar36 + -lVar27 != lVar30);
          }
          uVar28 = (uint)uVar33;
          if (start_00 < iVar24) {
            uVar33 = (ulong)iVar24;
            pEVar37 = keys + uVar33;
            do {
              iVar24 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::ElementCompare::operator()(compare,pEVar37,&local_88);
              uVar34 = uVar33;
              if (iVar24 < 0) break;
              uVar33 = uVar33 - 1;
              pEVar37 = pEVar37 + -1;
              uVar34 = uVar26;
            } while (lVar25 < (long)uVar33);
LAB_0043d1f2:
            uVar33 = (ulong)uVar28;
          }
        }
        iVar36 = (int)uVar33;
        iVar24 = (int)uVar34;
        if (iVar24 <= iVar36) goto LAB_0043d2ef;
        uVar5 = *(undefined8 *)keys[iVar36].val.m_backend.data._M_elems;
        uVar6 = *(undefined8 *)(keys[iVar36].val.m_backend.data._M_elems + 2);
        puVar2 = keys[iVar36].val.m_backend.data._M_elems + 4;
        uVar7 = *(undefined8 *)puVar2;
        uVar8 = *(undefined8 *)(puVar2 + 2);
        puVar2 = keys[iVar36].val.m_backend.data._M_elems + 8;
        uVar9 = *(undefined8 *)puVar2;
        uVar10 = *(undefined8 *)(puVar2 + 2);
        puVar2 = keys[iVar36].val.m_backend.data._M_elems + 0xc;
        uVar11 = *(undefined8 *)puVar2;
        uVar12 = *(undefined8 *)(puVar2 + 2);
        iVar23 = keys[iVar36].val.m_backend.exp;
        bVar3 = keys[iVar36].val.m_backend.neg;
        iVar4 = keys[iVar36].idx;
        uVar13 = *(undefined8 *)(keys[iVar24].val.m_backend.data._M_elems + 2);
        puVar2 = keys[iVar24].val.m_backend.data._M_elems + 4;
        uVar14 = *(undefined8 *)puVar2;
        uVar15 = *(undefined8 *)(puVar2 + 2);
        puVar2 = keys[iVar24].val.m_backend.data._M_elems + 8;
        uVar16 = *(undefined8 *)puVar2;
        uVar17 = *(undefined8 *)(puVar2 + 2);
        puVar2 = keys[iVar24].val.m_backend.data._M_elems + 0xc;
        uVar18 = *(undefined8 *)puVar2;
        uVar19 = *(undefined8 *)(puVar2 + 2);
        *(undefined8 *)keys[iVar36].val.m_backend.data._M_elems =
             *(undefined8 *)keys[iVar24].val.m_backend.data._M_elems;
        *(undefined8 *)(keys[iVar36].val.m_backend.data._M_elems + 2) = uVar13;
        puVar2 = keys[iVar36].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = uVar14;
        *(undefined8 *)(puVar2 + 2) = uVar15;
        puVar2 = keys[iVar36].val.m_backend.data._M_elems + 8;
        *(undefined8 *)puVar2 = uVar16;
        *(undefined8 *)(puVar2 + 2) = uVar17;
        puVar2 = keys[iVar36].val.m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar2 = uVar18;
        *(undefined8 *)(puVar2 + 2) = uVar19;
        keys[iVar36].val.m_backend.exp = keys[iVar24].val.m_backend.exp;
        keys[iVar36].val.m_backend.neg = keys[iVar24].val.m_backend.neg;
        keys[iVar36].idx = keys[iVar24].idx;
        puVar2 = keys[iVar24].val.m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar2 = uVar11;
        *(undefined8 *)(puVar2 + 2) = uVar12;
        puVar2 = keys[iVar24].val.m_backend.data._M_elems + 8;
        *(undefined8 *)puVar2 = uVar9;
        *(undefined8 *)(puVar2 + 2) = uVar10;
        puVar2 = keys[iVar24].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = uVar7;
        *(undefined8 *)(puVar2 + 2) = uVar8;
        *(undefined8 *)keys[iVar24].val.m_backend.data._M_elems = uVar5;
        *(undefined8 *)(keys[iVar24].val.m_backend.data._M_elems + 2) = uVar6;
        keys[iVar24].val.m_backend.exp = iVar23;
        keys[iVar24].val.m_backend.neg = bVar3;
        fVar21 = keys[iVar36].val.m_backend.fpclass;
        iVar22 = keys[iVar36].val.m_backend.prec_elem;
        iVar20 = keys[iVar24].val.m_backend.prec_elem;
        keys[iVar36].val.m_backend.fpclass = keys[iVar24].val.m_backend.fpclass;
        keys[iVar36].val.m_backend.prec_elem = iVar20;
        keys[iVar24].val.m_backend.fpclass = fVar21;
        keys[iVar24].val.m_backend.prec_elem = iVar22;
        keys[iVar24].idx = iVar4;
        uVar33 = (ulong)(iVar36 + 1);
        uVar34 = (ulong)(iVar24 - 1);
      } while( true );
    }
LAB_0043d5bf:
    if (0 < (int)uVar28) {
      SPxShellsort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
                (keys,uVar31,compare,start);
    }
  }
  return;
LAB_0043d2ef:
  if ((type & 1U) == 0) {
    if (start_00 < iVar24) {
      uVar35 = (ulong)iVar24;
      pEVar37 = keys + uVar35;
      do {
        iVar24 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::ElementCompare::operator()(compare,&local_88,pEVar37);
        uVar34 = uVar35;
        if (0 < iVar24) break;
        uVar35 = uVar35 - 1;
        pEVar37 = pEVar37 + -1;
        uVar34 = uVar26;
      } while (lVar25 < (long)uVar35);
    }
    if ((int)uVar34 == iVar29) {
      uVar5 = *(undefined8 *)keys[lVar27].val.m_backend.data._M_elems;
      uVar6 = *(undefined8 *)(keys[lVar27].val.m_backend.data._M_elems + 2);
      puVar2 = keys[lVar27].val.m_backend.data._M_elems + 4;
      uVar7 = *(undefined8 *)puVar2;
      uVar8 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[lVar27].val.m_backend.data._M_elems + 8;
      uVar9 = *(undefined8 *)puVar2;
      uVar10 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[lVar27].val.m_backend.data._M_elems + 0xc;
      uVar11 = *(undefined8 *)puVar2;
      uVar12 = *(undefined8 *)(puVar2 + 2);
      iVar24 = keys[lVar27].val.m_backend.exp;
      bVar3 = keys[lVar27].val.m_backend.neg;
      iVar36 = keys[lVar27].idx;
      uVar13 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2);
      uVar14 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4);
      uVar15 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6);
      uVar16 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8);
      uVar17 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 10);
      uVar18 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xc);
      uVar19 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xe);
      *(undefined8 *)keys[lVar27].val.m_backend.data._M_elems =
           *(undefined8 *)(pNVar1->val).m_backend.data._M_elems;
      *(undefined8 *)(keys[lVar27].val.m_backend.data._M_elems + 2) = uVar13;
      puVar2 = keys[lVar27].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar14;
      *(undefined8 *)(puVar2 + 2) = uVar15;
      puVar2 = keys[lVar27].val.m_backend.data._M_elems + 8;
      *(undefined8 *)puVar2 = uVar16;
      *(undefined8 *)(puVar2 + 2) = uVar17;
      puVar2 = keys[lVar27].val.m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar2 = uVar18;
      *(undefined8 *)(puVar2 + 2) = uVar19;
      keys[lVar27].val.m_backend.exp = (pNVar1->val).m_backend.exp;
      keys[lVar27].val.m_backend.neg = (pNVar1->val).m_backend.neg;
      keys[lVar27].idx = pNVar1->idx;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xc) = uVar11;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xe) = uVar12;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8) = uVar9;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 10) = uVar10;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4) = uVar7;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6) = uVar8;
      *(undefined8 *)(pNVar1->val).m_backend.data._M_elems = uVar5;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2) = uVar6;
      (pNVar1->val).m_backend.exp = iVar24;
      (pNVar1->val).m_backend.neg = bVar3;
      fVar21 = keys[lVar27].val.m_backend.fpclass;
      iVar22 = keys[lVar27].val.m_backend.prec_elem;
      iVar20 = (pNVar1->val).m_backend.prec_elem;
      keys[lVar27].val.m_backend.fpclass = (pNVar1->val).m_backend.fpclass;
      keys[lVar27].val.m_backend.prec_elem = iVar20;
      (pNVar1->val).m_backend.fpclass = fVar21;
      (pNVar1->val).m_backend.prec_elem = iVar22;
      pNVar1->idx = iVar36;
      uVar34 = (ulong)(iVar29 - 1);
    }
  }
  else {
    if (iVar36 < iVar29) {
      pEVar37 = keys + iVar36;
      lVar30 = 0;
      do {
        iVar24 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::ElementCompare::operator()(compare,&local_88,pEVar37);
        if (iVar24 < 0) {
          uVar33 = (ulong)(uint)(iVar36 - (int)lVar30);
          break;
        }
        lVar30 = lVar30 + -1;
        pEVar37 = pEVar37 + 1;
        uVar33 = uVar32;
      } while (iVar36 - lVar27 != lVar30);
    }
    if ((int)uVar33 == start_00) {
      uVar5 = *(undefined8 *)keys[lVar25].val.m_backend.data._M_elems;
      uVar6 = *(undefined8 *)(keys[lVar25].val.m_backend.data._M_elems + 2);
      puVar2 = keys[lVar25].val.m_backend.data._M_elems + 4;
      uVar7 = *(undefined8 *)puVar2;
      uVar8 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[lVar25].val.m_backend.data._M_elems + 8;
      uVar9 = *(undefined8 *)puVar2;
      uVar10 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[lVar25].val.m_backend.data._M_elems + 0xc;
      uVar11 = *(undefined8 *)puVar2;
      uVar12 = *(undefined8 *)(puVar2 + 2);
      iVar24 = keys[lVar25].val.m_backend.exp;
      bVar3 = keys[lVar25].val.m_backend.neg;
      iVar36 = keys[lVar25].idx;
      uVar13 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2);
      uVar14 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4);
      uVar15 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6);
      uVar16 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8);
      uVar17 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 10);
      uVar18 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xc);
      uVar19 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xe);
      *(undefined8 *)keys[lVar25].val.m_backend.data._M_elems =
           *(undefined8 *)(pNVar1->val).m_backend.data._M_elems;
      *(undefined8 *)(keys[lVar25].val.m_backend.data._M_elems + 2) = uVar13;
      puVar2 = keys[lVar25].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar14;
      *(undefined8 *)(puVar2 + 2) = uVar15;
      puVar2 = keys[lVar25].val.m_backend.data._M_elems + 8;
      *(undefined8 *)puVar2 = uVar16;
      *(undefined8 *)(puVar2 + 2) = uVar17;
      puVar2 = keys[lVar25].val.m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar2 = uVar18;
      *(undefined8 *)(puVar2 + 2) = uVar19;
      keys[lVar25].val.m_backend.exp = (pNVar1->val).m_backend.exp;
      keys[lVar25].val.m_backend.neg = (pNVar1->val).m_backend.neg;
      keys[lVar25].idx = pNVar1->idx;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xc) = uVar11;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xe) = uVar12;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8) = uVar9;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 10) = uVar10;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4) = uVar7;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6) = uVar8;
      *(undefined8 *)(pNVar1->val).m_backend.data._M_elems = uVar5;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2) = uVar6;
      (pNVar1->val).m_backend.exp = iVar24;
      (pNVar1->val).m_backend.neg = bVar3;
      fVar21 = keys[lVar25].val.m_backend.fpclass;
      iVar22 = keys[lVar25].val.m_backend.prec_elem;
      iVar20 = (pNVar1->val).m_backend.prec_elem;
      keys[lVar25].val.m_backend.fpclass = (pNVar1->val).m_backend.fpclass;
      keys[lVar25].val.m_backend.prec_elem = iVar20;
      (pNVar1->val).m_backend.fpclass = fVar21;
      (pNVar1->val).m_backend.prec_elem = iVar22;
      pNVar1->idx = iVar36;
      uVar33 = (ulong)(start_00 + 1);
    }
  }
  iVar24 = (int)uVar34;
  uVar28 = iVar24 - start_00;
  iVar36 = (int)uVar33;
  uVar31 = iVar29 - iVar36;
  if ((int)uVar31 < (int)uVar28) {
    uVar32 = uVar34 & 0xffffffff;
    uVar33 = uVar26;
    uVar31 = uVar28;
    iVar24 = iVar29;
    start_00 = iVar36;
    if (iVar29 <= iVar36) goto LAB_0043d5a4;
  }
  else {
    uVar26 = uVar33;
    uVar28 = uVar31;
    if (iVar24 <= start_00) goto LAB_0043d5a4;
  }
  SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
            (keys,iVar24 + 1,compare,start_00,(bool)(~type & 1));
  uVar26 = uVar33;
  uVar28 = uVar31;
LAB_0043d5a4:
  uVar31 = (uint)uVar32;
  start = (int)uVar26;
  type = (bool)(type ^ 1);
  if ((int)uVar28 < 0x19) goto LAB_0043d5bf;
  goto LAB_0043cfff;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}